

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O3

void mpp_writer_put_bits(MppWriteCtx *ctx,RK_S32 val,RK_S32 len)

{
  bool bVar1;
  uint uVar2;
  RK_U32 RVar3;
  uint uVar4;
  RK_U8 RVar5;
  uint uVar6;
  uint uVar7;
  RK_U8 *pRVar8;
  
  pRVar8 = ctx->stream;
  uVar4 = ctx->byte_buffer;
  if ((val != 0) &&
     (((1 << ((byte)len & 0x1f) <= val &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"val < (1 << len)",
                   "mpp_writer_put_bits",0x77), (mpp_debug._3_1_ & 0x10) != 0)) ||
      ((0x18 < len &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"len < 25",
                   "mpp_writer_put_bits",0x78), (mpp_debug._3_1_ & 0x10) != 0)))))) {
    abort();
  }
  uVar6 = len + ctx->buffered_bits;
  uVar4 = val << (-(char)uVar6 & 0x1fU) | uVar4;
  if (7 < (int)uVar6) {
    uVar2 = ctx->byte_cnt;
    uVar7 = uVar6;
    do {
      if (ctx->size < uVar2) {
        ctx->overflow = 1;
        return;
      }
      RVar3 = ctx->zero_bytes;
      RVar5 = (RK_U8)(uVar4 >> 0x18);
      *pRVar8 = RVar5;
      uVar6 = uVar2 + 1;
      if ((RVar3 == 2) && (RVar3 = 2, uVar4 < 0x4000000)) {
        *pRVar8 = '\x03';
        pRVar8[1] = RVar5;
        ctx->emul_cnt = ctx->emul_cnt + 1;
        RVar5 = pRVar8[1];
        pRVar8 = pRVar8 + 1;
        RVar3 = 0;
        uVar6 = uVar2 + 2;
      }
      uVar2 = uVar6;
      RVar3 = RVar3 + 1;
      if (RVar5 != '\0') {
        RVar3 = 0;
      }
      uVar6 = uVar7 - 8;
      uVar4 = uVar4 << 8;
      pRVar8 = pRVar8 + 1;
      ctx->zero_bytes = RVar3;
      ctx->byte_cnt = uVar2;
      ctx->stream = pRVar8;
      bVar1 = 0xf < (int)uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  ctx->buffered_bits = uVar6 & 0xff;
  ctx->byte_buffer = uVar4;
  return;
}

Assistant:

void mpp_writer_put_bits(MppWriteCtx * ctx, RK_S32 val, RK_S32 len)
{
    RK_S32 bits;
    RK_U8 *stream = ctx->stream;
    RK_U32 byte_buffer = ctx->byte_buffer;

    if (val) {
        mpp_assert(val < (1 << len));
        mpp_assert(len < 25);
    }
    bits = len + ctx->buffered_bits;

    byte_buffer = byte_buffer | ((RK_U32) val << (32 - bits));

    while (bits > 7) {
        RK_S32 zeroBytes = ctx->zero_bytes;
        RK_S32 byteCnt = ctx->byte_cnt;

        if (mpp_writer_status(ctx))
            return;

        *stream = (RK_U8) (byte_buffer >> 24);

        byteCnt++;
        if ((zeroBytes == 2) && (*stream < 4)) {
            *stream++ = 3;
            *stream = (RK_U8) (byte_buffer >> 24);
            byteCnt++;
            zeroBytes = 0;
            ctx->emul_cnt++;
        }

        if (*stream == 0)
            zeroBytes++;
        else
            zeroBytes = 0;

        bits -= 8;
        byte_buffer <<= 8;
        stream++;
        ctx->zero_bytes = zeroBytes;
        ctx->byte_cnt = byteCnt;
        ctx->stream = stream;
    }

    ctx->buffered_bits = (RK_U8) bits;
    ctx->byte_buffer = byte_buffer;
}